

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSConverter.cpp
# Opt level: O3

void __thiscall Assimp::Discreet3DSImporter::MakeUnique(Discreet3DSImporter *this,Mesh *sMesh)

{
  uint uVar1;
  pointer paVar2;
  float fVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  pointer pFVar7;
  ulong uVar8;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> vNew2;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> vNew;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_48;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_30;
  
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            (&local_30,
             ((long)(sMesh->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces.
                    super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(sMesh->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces.
                    super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 4) * 3,(allocator_type *)&local_48);
  local_48.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((sMesh->mTexCoords).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (sMesh->mTexCoords).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
              (&local_48,
               ((long)(sMesh->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces.
                      super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(sMesh->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces.
                      super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 4) * 3);
  }
  pFVar7 = (sMesh->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces.
           super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((sMesh->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces.
      super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>._M_impl.
      super__Vector_impl_data._M_finish != pFVar7) {
    uVar4 = 0;
    uVar5 = 0;
    do {
      lVar6 = 0;
      do {
        uVar1 = pFVar7[uVar5].super_FaceWithSmoothingGroup.mIndices[lVar6];
        paVar2 = (sMesh->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mPositions.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar8 = (ulong)uVar4 + lVar6 & 0xffffffff;
        local_30.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_start[uVar8].z = *(float *)((long)(paVar2 + uVar1) + 8);
        paVar2 = paVar2 + uVar1;
        fVar3 = paVar2->y;
        local_30.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_start[uVar8].x = paVar2->x;
        local_30.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_start[uVar8].y = fVar3;
        paVar2 = (sMesh->mTexCoords).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((sMesh->mTexCoords).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_finish != paVar2) {
          uVar1 = pFVar7[uVar5].super_FaceWithSmoothingGroup.mIndices[lVar6];
          local_48.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar8].z = paVar2[uVar1].z;
          fVar3 = paVar2[uVar1].y;
          local_48.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar8].x = paVar2[uVar1].x;
          local_48.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar8].y = fVar3;
        }
        pFVar7[uVar5].super_FaceWithSmoothingGroup.mIndices[lVar6] =
             (uint32_t)((ulong)uVar4 + lVar6);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      uVar5 = (ulong)((int)uVar5 + 1);
      pFVar7 = (sMesh->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces.
               super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = uVar4 + 3;
    } while (uVar5 < (ulong)((long)(sMesh->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces
                                   .
                                   super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar7 >> 4));
  }
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator=
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)sMesh,&local_30);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator=
            (&sMesh->mTexCoords,&local_48);
  if (local_48.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_30.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Discreet3DSImporter::MakeUnique(D3DS::Mesh& sMesh)
{
    // TODO: really necessary? I don't think. Just a waste of memory and time
    // to do it now in a separate buffer.

    // Allocate output storage
    std::vector<aiVector3D> vNew  (sMesh.mFaces.size() * 3);
    std::vector<aiVector3D> vNew2;
    if (sMesh.mTexCoords.size())
        vNew2.resize(sMesh.mFaces.size() * 3);

    for (unsigned int i = 0, base = 0; i < sMesh.mFaces.size();++i)
    {
        D3DS::Face& face = sMesh.mFaces[i];

        // Positions
        for (unsigned int a = 0; a < 3;++a,++base)
        {
            vNew[base] = sMesh.mPositions[face.mIndices[a]];
            if (sMesh.mTexCoords.size())
                vNew2[base] = sMesh.mTexCoords[face.mIndices[a]];

            face.mIndices[a] = base;
        }
    }
    sMesh.mPositions = vNew;
    sMesh.mTexCoords = vNew2;
}